

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

size_t Corrade::Utility::
       formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
                 (MutableStringView *buffer,char *format,BasicStringView<const_char> *args,
                 BasicStringView<const_char> *args_1,BasicStringView<const_char> *args_2,
                 String *args_3,BasicStringView<const_char> *args_4,
                 BasicStringView<const_char> *args_5,BasicStringView<const_char> *args_6,
                 unsigned_long *args_7,char **args_8)

{
  size_t sVar1;
  BufferFormatter formatters [10];
  
  formatters[0].size = 0xffffffffffffffff;
  formatters[0]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[1].size = 0xffffffffffffffff;
  formatters[1]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[2].size = 0xffffffffffffffff;
  formatters[2]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[3].size = 0xffffffffffffffff;
  formatters[3]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::String>(Corrade::Containers::String_const&)::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[4].size = 0xffffffffffffffff;
  formatters[4]._value = args_4;
  formatters[4]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[5].size = 0xffffffffffffffff;
  formatters[5]._value = args_5;
  formatters[5]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[6].size = 0xffffffffffffffff;
  formatters[6]._value = args_6;
  formatters[6]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[7].size = 0xffffffffffffffff;
  formatters[7]._value = args_7;
  formatters[7]._fn =
       Implementation::BufferFormatter::BufferFormatter<unsigned_long>(unsigned_long_const&)::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[8].size = 0xffffffffffffffff;
  formatters[8]._value = args_8;
  formatters[8]._fn =
       Implementation::BufferFormatter::BufferFormatter<char_const*>(char_const*const&)::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[9].size = 0xffffffffffffffff;
  formatters[9]._fn = (_func_size_t_MutableStringView_ptr_void_ptr_int_FormatType *)0x0;
  formatters[9]._value = (void *)0x0;
  formatters[0]._value = args;
  formatters[1]._value = args_1;
  formatters[2]._value = args_2;
  formatters[3]._value = args_3;
  sVar1 = Implementation::formatFormatters(buffer,format,formatters,9);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}